

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausSimInfoCheck(Clu_Man_t *p,int *pLits,int nLits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  uint local_c4;
  uint local_c0;
  int local_bc;
  int local_b8;
  int w;
  int i;
  int iVar;
  int nWords;
  uint uWord;
  uint *pSims [16];
  int nLits_local;
  int *pLits_local;
  Clu_Man_t *p_local;
  
  pSims[0xf]._4_4_ = nLits;
  for (local_b8 = 0; local_b8 < pSims[0xf]._4_4_; local_b8 = local_b8 + 1) {
    iVar1 = lit_var(pLits[local_b8]);
    iVar1 = iVar1 - p->nFrames * p->pCnf->nVars;
    if ((iVar1 < 1) || (p->pCnf->nVars <= iVar1)) {
      __assert_fail("iVar > 0 && iVar < p->pCnf->nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,0x427,"int Fra_ClausSimInfoCheck(Clu_Man_t *, int *, int)");
    }
    pvVar4 = Vec_PtrEntry(p->vCexes,iVar1);
    *(void **)(&nWords + (long)local_b8 * 2) = pvVar4;
  }
  iVar1 = p->nCexes;
  for (local_bc = 0; local_bc < iVar1 / 0x20; local_bc = local_bc + 1) {
    iVar = -1;
    for (local_b8 = 0; local_b8 < pSims[0xf]._4_4_; local_b8 = local_b8 + 1) {
      iVar2 = lit_sign(pLits[local_b8]);
      if (iVar2 == 0) {
        local_c0 = *(uint *)(*(long *)(&nWords + (long)local_b8 * 2) + (long)local_bc * 4) ^
                   0xffffffff;
      }
      else {
        local_c0 = *(uint *)(*(long *)(&nWords + (long)local_b8 * 2) + (long)local_bc * 4);
      }
      iVar = local_c0 & iVar;
    }
    if (iVar != 0) {
      return 1;
    }
  }
  if (p->nCexes % 0x20 != 0) {
    iVar = -1;
    for (local_b8 = 0; local_b8 < pSims[0xf]._4_4_; local_b8 = local_b8 + 1) {
      iVar1 = lit_sign(pLits[local_b8]);
      if (iVar1 == 0) {
        local_c4 = *(uint *)(*(long *)(&nWords + (long)local_b8 * 2) + (long)local_bc * 4) ^
                   0xffffffff;
      }
      else {
        local_c4 = *(uint *)(*(long *)(&nWords + (long)local_b8 * 2) + (long)local_bc * 4);
      }
      iVar = local_c4 & iVar;
    }
    uVar3 = Abc_InfoMask(p->nCexes % 0x20);
    if ((iVar & uVar3) != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Fra_ClausSimInfoCheck( Clu_Man_t * p, int * pLits, int nLits )
{
    unsigned * pSims[16], uWord;
    int nWords, iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]) - p->nFrames * p->pCnf->nVars;
        assert( iVar > 0 && iVar < p->pCnf->nVars );
        pSims[i] = (unsigned *)Vec_PtrEntry( p->vCexes, iVar );
    }
    nWords = p->nCexes / 32;
    for ( w = 0; w < nWords; w++ )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord )
            return 1;
    }
    if ( p->nCexes % 32 )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord & Abc_InfoMask( p->nCexes % 32 ) )
            return 1;
    }
    return 0;
}